

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::erase
          (pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
          *this,iterator _begin,iterator _end)

{
  ulong uVar1;
  undefined1 auVar2 [12];
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar6;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *pbVar7;
  ulong uVar8;
  iterator iVar9;
  iterator _begin_00;
  iterator iter;
  iterator iter_00;
  iterator _end_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  local_40;
  
  pbVar7 = _end.node;
  pbVar6 = _begin.node;
  iVar5 = _begin.position;
  if (iVar5 == _end.position && pbVar6 == pbVar7) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    local_40.node = pbVar6;
    local_40.position = iVar5;
    do {
      do {
        uVar3 = uVar8;
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
        ::increment(&local_40);
        uVar8 = uVar3 + 1;
      } while (local_40.node != pbVar7);
    } while (local_40.position != _end.position);
    uVar1 = this->size_;
    if (uVar1 == uVar8) {
      internal_clear(this,(this->root_).
                          super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
                          ._M_head_impl);
      (this->root_).
      super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
      ._M_head_impl =
           (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
            *)&btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
               ::EmptyNode()::empty_node;
      this->rightmost_ =
           (node_type *)
           &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
            EmptyNode()::empty_node;
      this->size_ = 0;
      iVar9 = end(this);
      auVar2 = iVar9._0_12_;
    }
    else {
      if (pbVar6 != pbVar7) {
        if (uVar3 < uVar1) {
          uVar3 = uVar1;
          do {
            if (((ulong)pbVar6 & 7) != 0) {
              __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                            ,0xf84,
                            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *, unsigned char, long, phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                           );
            }
            if (pbVar6[0xb] ==
                (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                 )0x0) {
              iter.position = iVar5;
              iter.node = pbVar6;
              iter._12_4_ = 0;
              iVar9 = erase(this,iter);
              auVar2 = iVar9._0_12_;
            }
            else {
              uVar4 = (uVar3 - uVar1) + uVar8;
              _begin_00._8_8_ = (long)iVar5;
              uVar3 = (ulong)(byte)pbVar6[10] - _begin_00._8_8_;
              if (uVar4 < (ulong)(byte)pbVar6[10] - _begin_00._8_8_) {
                uVar3 = uVar4;
              }
              _begin_00.node = pbVar6;
              iVar9 = erase_from_leaf_node(this,_begin_00,uVar3);
              auVar2 = iVar9._0_12_;
            }
            pbVar6 = auVar2._0_8_;
            iVar5 = auVar2._8_4_;
            uVar3 = this->size_;
          } while (uVar1 - uVar8 < uVar3);
        }
        goto LAB_001ed8e6;
      }
      auVar2 = _begin._0_12_;
      iVar9._12_4_ = 0;
      iVar9.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                    *)auVar2._0_8_;
      iVar9.position = auVar2._8_4_;
      _end_00._12_4_ = 0;
      _end_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                      *)SUB128(_end._0_12_,0);
      _end_00.position = SUB124(_end._0_12_,8);
      erase_same_node(this,iVar9,_end_00);
      this->size_ = this->size_ - uVar8;
      iter_00._12_4_ = 0;
      iter_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
                      *)auVar2._0_8_;
      iter_00.position = auVar2._8_4_;
      iVar9 = rebalance_after_delete(this,iter_00);
      auVar2 = iVar9._0_12_;
    }
    pbVar6 = auVar2._0_8_;
    iVar5 = auVar2._8_4_;
  }
LAB_001ed8e6:
  __return_storage_ptr__->first = uVar8;
  (__return_storage_ptr__->second).node = pbVar6;
  (__return_storage_ptr__->second).position = iVar5;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::erase(iterator _begin, iterator _end)
        -> std::pair<size_type, iterator> {
        difference_type count = std::distance(_begin, _end);
        assert(count >= 0);

        if (count == 0) {
            return {0, _begin};
        }

        if (count == (difference_type)size_) {
            clear();
            return {count, this->end()};
        }

        if (_begin.node == _end.node) {
            erase_same_node(_begin, _end);
            size_ -= count;
            return {count, rebalance_after_delete(_begin)};
        }

        const size_type target_size = size_ - count;
        while (size_ > target_size) {
            if (_begin.node->leaf()) {
                const size_type remaining_to_erase = size_ - target_size;
                const size_type remaining_in_node = _begin.node->count() - _begin.position;
                _begin = erase_from_leaf_node(
                    _begin, (std::min)(remaining_to_erase, remaining_in_node));
            } else {
                _begin = erase(_begin);
            }
        }
        return {count, _begin};
    }